

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void Assimp::OpenGEX::getRefNames
               (DDLNode *node,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names)

{
  Text *pTVar1;
  Reference *pRVar2;
  ulong uVar3;
  string name;
  allocator local_49;
  value_type local_48;
  
  if (node != (DDLNode *)0x0) {
    pRVar2 = ODDLParser::DDLNode::getReferences(node);
    if (pRVar2 != (Reference *)0x0) {
      for (uVar3 = 0; uVar3 < pRVar2->m_numRefs; uVar3 = uVar3 + 1) {
        if ((pRVar2->m_referencedName[uVar3] != (Name *)0x0) &&
           (pTVar1 = pRVar2->m_referencedName[uVar3]->m_id, pTVar1 != (Text *)0x0)) {
          std::__cxx11::string::string((string *)&local_48,pTVar1->m_buffer,&local_49);
          if (local_48._M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(names,&local_48);
          }
          std::__cxx11::string::~string((string *)&local_48);
        }
      }
    }
    return;
  }
  __assert_fail("nullptr != node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                ,0x1f2,"void Assimp::OpenGEX::getRefNames(DDLNode *, std::vector<std::string> &)");
}

Assistant:

static void getRefNames( DDLNode *node, std::vector<std::string> &names ) {
    ai_assert( nullptr != node );

    Reference *ref = node->getReferences();
    if( nullptr != ref ) {
        for( size_t i = 0; i < ref->m_numRefs; i++ )  {
            Name *currentName( ref->m_referencedName[ i ] );
            if( nullptr != currentName && nullptr != currentName->m_id ) {
#ifdef ASSIMP_USE_HUNTER
                const std::string name( currentName->m_id->m_text.m_buffer );
#else
                const std::string name( currentName->m_id->m_buffer );
#endif
                if( !name.empty() ) {
                    names.push_back( name );
                }
            }
        }
    }
}